

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

btVector3 __thiscall btMultiBody::getAngularMomentum(btMultiBody *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  btMultibodyLink *pbVar10;
  btVector3 *pbVar11;
  btQuaternion *pbVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  btVector3 bVar28;
  btAlignedObjectArray<btQuaternion> rot_from_world;
  btAlignedObjectArray<btVector3> omega;
  btAlignedObjectArray<btVector3> vel;
  btAlignedObjectArray<btQuaternion> bStack_a8;
  btAlignedObjectArray<btVector3> local_88;
  btAlignedObjectArray<btVector3> local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  iVar9 = (this->m_links).m_size;
  uVar15 = iVar9 + 1;
  local_88.m_ownsMemory = true;
  local_88.m_data = (btVector3 *)0x0;
  local_88.m_size = 0;
  local_88.m_capacity = 0;
  uVar17 = (ulong)uVar15;
  if (-1 < (long)iVar9) {
    pbVar11 = (btVector3 *)btAlignedAllocInternal(uVar17 << 4,0x10);
    if (0 < (long)local_88.m_size) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_88.m_data)->m_floats + lVar13);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar11->m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + 0x10;
      } while ((long)local_88.m_size * 0x10 != lVar13);
    }
    if ((local_88.m_data != (btVector3 *)0x0) && (local_88.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_88.m_data);
    }
    local_88._4_8_ = (ulong)uVar15 << 0x20;
    local_88.m_data = pbVar11;
  }
  local_88.m_ownsMemory = true;
  local_88.m_size = uVar15;
  local_68.m_ownsMemory = true;
  local_68.m_data = (btVector3 *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  if (-1 < iVar9) {
    pbVar11 = (btVector3 *)btAlignedAllocInternal(uVar17 << 4,0x10);
    if (0 < (long)local_68.m_size) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_68.m_data)->m_floats + lVar13);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar11->m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + 0x10;
      } while ((long)local_68.m_size * 0x10 != lVar13);
    }
    if ((local_68.m_data != (btVector3 *)0x0) && (local_68.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_68.m_data);
    }
    local_68._4_8_ = (ulong)uVar15 << 0x20;
    local_68.m_data = pbVar11;
  }
  local_68.m_ownsMemory = true;
  local_68.m_size = uVar15;
  bStack_a8.m_ownsMemory = true;
  bStack_a8.m_data = (btQuaternion *)0x0;
  bStack_a8.m_size = 0;
  bStack_a8.m_capacity = 0;
  if (-1 < iVar9) {
    pbVar12 = (btQuaternion *)btAlignedAllocInternal(uVar17 << 4,0x10);
    if (0 < (long)bStack_a8.m_size) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)((bStack_a8.m_data)->super_btQuadWord).m_floats + lVar13);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)(pbVar12->super_btQuadWord).m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar13 = lVar13 + 0x10;
      } while ((long)bStack_a8.m_size * 0x10 != lVar13);
    }
    if ((bStack_a8.m_data != (btQuaternion *)0x0) && (bStack_a8.m_ownsMemory == true)) {
      btAlignedFreeInternal(bStack_a8.m_data);
    }
    bStack_a8._4_8_ = (ulong)uVar15 << 0x20;
    bStack_a8.m_data = pbVar12;
  }
  bStack_a8.m_ownsMemory = true;
  bStack_a8.m_size = uVar15;
  compTreeLinkVelocities(this,local_88.m_data,local_68.m_data);
  uVar5 = *(undefined8 *)((this->m_baseQuat).super_btQuadWord.m_floats + 2);
  *(undefined8 *)((bStack_a8.m_data)->super_btQuadWord).m_floats =
       *(undefined8 *)(this->m_baseQuat).super_btQuadWord.m_floats;
  *(undefined8 *)(((bStack_a8.m_data)->super_btQuadWord).m_floats + 2) = uVar5;
  fVar21 = ((bStack_a8.m_data)->super_btQuadWord).m_floats[0];
  fVar4 = ((bStack_a8.m_data)->super_btQuadWord).m_floats[3];
  fVar18 = (this->m_baseInertia).m_floats[2] * (local_88.m_data)->m_floats[2];
  uVar5 = *(undefined8 *)(((bStack_a8.m_data)->super_btQuadWord).m_floats + 1);
  fVar23 = (float)((ulong)uVar5 >> 0x20);
  fVar20 = (float)uVar5;
  uVar5 = *(undefined8 *)(this->m_baseInertia).m_floats;
  fVar24 = (float)*(undefined8 *)(local_88.m_data)->m_floats * (float)uVar5;
  fVar25 = (float)((ulong)*(undefined8 *)(local_88.m_data)->m_floats >> 0x20) *
           (float)((ulong)uVar5 >> 0x20);
  fVar26 = fVar20 * fVar24 + (fVar18 * fVar4 - fVar25 * fVar21);
  fVar27 = fVar23 * fVar25 + (fVar24 * fVar4 - fVar18 * fVar20);
  fVar19 = fVar18 * fVar23 + fVar24 * fVar21 + fVar25 * fVar20;
  fVar22 = -fVar20;
  fVar18 = fVar21 * fVar18 + (fVar4 * fVar25 - fVar24 * fVar23);
  local_48 = fVar22 * fVar26 + fVar23 * fVar18 + fVar19 * fVar21 + fVar27 * fVar4;
  fStack_44 = -fVar23 * fVar27 + fVar21 * fVar26 + fVar19 * fVar20 + fVar18 * fVar4;
  fStack_40 = fVar22 * ((fVar25 * fVar4 - fVar25 * 0.0) + 0.0) +
              fVar23 * fVar27 + fVar19 * 0.0 + fVar27 * fVar4;
  fStack_3c = fVar22 * ((fVar25 * fVar4 - fVar25 * fVar23) + 0.0) +
              fVar23 * fVar27 + fVar19 * fVar23 + fVar27 * fVar4;
  fVar21 = fVar18 * -fVar21 + fVar27 * fVar20 + fVar19 * fVar23 + fVar26 * fVar4;
  if (0 < iVar9) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      pbVar10 = (this->m_links).m_data;
      lVar16 = (long)*(int *)((long)(pbVar10->m_zeroRotParentToThis).super_btQuadWord.m_floats +
                             lVar14 + -4);
      fVar4 = *(float *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar14
                        );
      uVar5 = *(undefined8 *)bStack_a8.m_data[lVar16 + 1].super_btQuadWord.m_floats;
      uVar6 = *(undefined8 *)(bStack_a8.m_data[lVar16 + 1].super_btQuadWord.m_floats + 2);
      uVar7 = *(undefined8 *)
               ((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar14);
      uVar8 = *(undefined8 *)
               ((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar14 + 4);
      fVar20 = -fVar4;
      fVar23 = (float)uVar6;
      fVar24 = (float)((ulong)uVar6 >> 0x20);
      fVar18 = *(float *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                         lVar14 + 0xc);
      fVar19 = (float)uVar5;
      fVar22 = (float)((ulong)uVar5 >> 0x20);
      fVar25 = (float)uVar8;
      fVar26 = (float)((ulong)uVar8 >> 0x20);
      pfVar3 = (float *)((long)bStack_a8.m_data[1].super_btQuadWord.m_floats + lVar13);
      *pfVar3 = fVar22 * -fVar26 + fVar23 * fVar25 + fVar18 * fVar19 + (float)uVar7 * fVar24;
      pfVar3[1] = fVar20 * fVar23 +
                  fVar19 * fVar26 + fVar18 * fVar22 + (float)((ulong)uVar7 >> 0x20) * fVar24;
      pfVar3[2] = (fVar4 * fVar22 + fVar18 * fVar23 + fVar26 * fVar24) - fVar19 * fVar25;
      pfVar3[3] = (-fVar25 * fVar22 + fVar18 * fVar24 + fVar20 * fVar19) - fVar23 * fVar26;
      fVar4 = *(float *)((long)bStack_a8.m_data[1].super_btQuadWord.m_floats + lVar13);
      pbVar10 = (this->m_links).m_data;
      fVar18 = *(float *)((long)bStack_a8.m_data[1].super_btQuadWord.m_floats + lVar13 + 0xc);
      fVar19 = *(float *)((long)(pbVar10->m_inertiaLocal).m_floats + lVar14 + 8) *
               *(float *)((long)local_88.m_data[1].m_floats + lVar13 + 8);
      uVar5 = *(undefined8 *)((long)bStack_a8.m_data[1].super_btQuadWord.m_floats + lVar13 + 4);
      uVar6 = *(undefined8 *)((long)(pbVar10->m_inertiaLocal).m_floats + lVar14);
      uVar7 = *(undefined8 *)((long)local_88.m_data[1].m_floats + lVar13);
      fVar24 = (float)uVar7 * (float)uVar6;
      fVar25 = (float)((ulong)uVar7 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
      fVar23 = (float)((ulong)uVar5 >> 0x20);
      fVar20 = (float)uVar5;
      fVar26 = fVar20 * fVar24 + (fVar19 * fVar18 - fVar25 * fVar4);
      fVar27 = fVar23 * fVar25 + (fVar24 * fVar18 - fVar19 * fVar20);
      fVar22 = fVar19 * fVar23 + fVar24 * fVar4 + fVar25 * fVar20;
      fVar24 = fVar4 * fVar19 + (fVar18 * fVar25 - fVar24 * fVar23);
      fVar19 = -fVar20;
      local_48 = local_48 + fVar19 * fVar26 + fVar23 * fVar24 + fVar22 * fVar4 + fVar27 * fVar18;
      fStack_44 = fStack_44 + -fVar23 * fVar27 + fVar4 * fVar26 + fVar22 * fVar20 + fVar24 * fVar18;
      fStack_40 = fStack_40 +
                  fVar19 * ((fVar25 * fVar18 - fVar25 * 0.0) + 0.0) +
                  fVar23 * fVar27 + fVar22 * 0.0 + fVar27 * fVar18;
      fStack_3c = fStack_3c +
                  fVar19 * ((fVar25 * fVar18 - fVar25 * fVar23) + 0.0) +
                  fVar23 * fVar27 + fVar22 * fVar23 + fVar27 * fVar18;
      fVar21 = fVar21 + fVar24 * -fVar4 + fVar27 * fVar20 + fVar22 * fVar23 + fVar26 * fVar18;
      lVar14 = lVar14 + 600;
      lVar13 = lVar13 + 0x10;
    } while ((long)iVar9 * 600 - lVar14 != 0);
  }
  local_38 = ZEXT416((uint)fVar21);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&bStack_a8);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_68);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_88);
  bVar28.m_floats[1] = fStack_44;
  bVar28.m_floats[0] = local_48;
  bVar28.m_floats[2] = (btScalar)local_38._0_4_;
  bVar28.m_floats[3] = (btScalar)local_38._4_4_;
  return (btVector3)bVar28.m_floats;
}

Assistant:

btVector3 btMultiBody::getAngularMomentum() const
{
	int num_links = getNumLinks();
    // TODO: would be better not to allocate memory here
    btAlignedObjectArray<btVector3> omega;omega.resize(num_links+1);
	btAlignedObjectArray<btVector3> vel;vel.resize(num_links+1);
    btAlignedObjectArray<btQuaternion> rot_from_world;rot_from_world.resize(num_links+1);
    compTreeLinkVelocities(&omega[0], &vel[0]);

    rot_from_world[0] = m_baseQuat;
    btVector3 result = quatRotate(rot_from_world[0].inverse() , (m_baseInertia * omega[0]));

    for (int i = 0; i < num_links; ++i) {
        rot_from_world[i+1] = m_links[i].m_cachedRotParentToThis * rot_from_world[m_links[i].m_parent+1];
        result += (quatRotate(rot_from_world[i+1].inverse() , (m_links[i].m_inertiaLocal * omega[i+1])));
    }

    return result;
}